

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vertex.cpp
# Opt level: O3

bool __thiscall Vertex::doesMatchWithErrors(Vertex *this,string *sequence)

{
  char cVar1;
  char cVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  
  uVar4 = 0;
  uVar5 = (uint)sequence->_M_string_length;
  if (0 < (int)uVar5) {
    uVar6 = 0;
    do {
      cVar1 = (this->seq_del)._M_dataplus._M_p[uVar6];
      cVar2 = (sequence->_M_dataplus)._M_p[uVar6];
      uVar3 = (int)uVar4 + (uint)(cVar2 == 'X' || (cVar1 == 'X' || cVar1 == cVar2));
      uVar4 = (ulong)uVar3;
      uVar6 = uVar6 + 1;
    } while ((uVar5 & 0x7fffffff) != uVar6);
    uVar4 = (ulong)uVar3;
  }
  return ~(ulong)(5 < this->treshhold) + (this->seq)._M_string_length <= uVar4;
}

Assistant:

bool Vertex::doesMatchWithErrors(string sequence){
    int count = 0;
    for(int i = 0; i < (int)sequence.size(); i++){
        if(this->seq_del[i] == sequence[i] or this->seq_del[i] == 'X' or sequence[i] == 'X'){
            count++;
        }
    }
    return this->treshhold > 5 ? count >= seq.size() - 2 : count >= seq.size() - 1;
}